

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O3

void __thiscall PFData_test_data2_Test::~PFData_test_data2_Test(PFData_test_data2_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(PFData_test, data2){
    // this file needs to exist, and should load
    PFData test("tests/inputs/press.init.pfb");
    int retval = test.loadHeader();
    EXPECT_EQ(0,retval);
    EXPECT_EQ(50,test.getNZ());
    EXPECT_EQ(41,test.getNY());
    EXPECT_EQ(41,test.getNX());
    EXPECT_NEAR(0,test.getZ(),.00001);
    EXPECT_NEAR(0,test.getY(),.00001);
    EXPECT_NEAR(0,test.getX(),.00001);
    EXPECT_EQ(16,test.getNumSubgrids());
    test.close();
}